

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<spirv_cross::Variant,_8UL>::reserve
          (SmallVector<spirv_cross::Variant,_8UL> *this,size_t count)

{
  char *pcVar1;
  ulong uVar2;
  Variant *pVVar3;
  Variant *pVVar4;
  long lVar5;
  ulong uVar6;
  
  if (count < 0xaaaaaaaaaaaaaab) {
    uVar2 = this->buffer_capacity;
    if (uVar2 < count) {
      uVar6 = 8;
      if (8 < uVar2) {
        uVar6 = uVar2;
      }
      do {
        uVar2 = uVar6;
        uVar6 = uVar2 * 2;
      } while (uVar2 < count);
      if (uVar2 < 9) {
        pVVar3 = (Variant *)&this->stack_storage;
      }
      else {
        pVVar3 = (Variant *)malloc(uVar2 * 0x18);
        if (pVVar3 == (Variant *)0x0) goto LAB_00345ce9;
      }
      pVVar4 = (this->super_VectorView<spirv_cross::Variant>).ptr;
      if ((pVVar3 != pVVar4) && ((this->super_VectorView<spirv_cross::Variant>).buffer_size != 0)) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          pVVar4 = (this->super_VectorView<spirv_cross::Variant>).ptr;
          pcVar1 = (char *)((long)&pVVar3->group + lVar5);
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          pcVar1[8] = '\0';
          pcVar1[9] = '\0';
          pcVar1[10] = '\0';
          pcVar1[0xb] = '\0';
          pcVar1[0xc] = '\0';
          pcVar1[0xd] = '\0';
          pcVar1[0xe] = '\0';
          pcVar1[0xf] = '\0';
          *(undefined8 *)((long)&pVVar3->holder + lVar5 + 5) = 0;
          Variant::operator=((Variant *)((long)&pVVar3->group + lVar5),
                             (Variant *)((long)&pVVar4->group + lVar5));
          Variant::~Variant((Variant *)
                            ((long)&((this->super_VectorView<spirv_cross::Variant>).ptr)->group +
                            lVar5));
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x18;
        } while (uVar6 < (this->super_VectorView<spirv_cross::Variant>).buffer_size);
        pVVar4 = (this->super_VectorView<spirv_cross::Variant>).ptr;
      }
      if (pVVar4 != (Variant *)&this->stack_storage) {
        free(pVVar4);
      }
      (this->super_VectorView<spirv_cross::Variant>).ptr = pVVar3;
      this->buffer_capacity = uVar2;
    }
    return;
  }
LAB_00345ce9:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}